

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

CURLUcode ipv6_parse(Curl_URL *u,char *hostname,size_t hlen)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  char *__s;
  CURLUcode CVar6;
  size_t sVar7;
  char *pcVar8;
  char zoneid [16];
  char dest [16];
  
  CVar6 = CURLUE_BAD_IPV6;
  if (3 < hlen) {
    __s = hostname + 1;
    sVar3 = strspn(__s,"0123456789abcdefABCDEF:.");
    sVar7 = hlen - 2;
    if (hlen - 2 == sVar3) {
LAB_0015f25b:
      __s[sVar7] = '\0';
      iVar2 = inet_pton(10,__s,dest);
      if (iVar2 == 1) {
        pcVar4 = inet_ntop(10,dest,zoneid,0x2e);
        if ((pcVar4 != (char *)0x0) && (sVar3 = strlen(zoneid), sVar3 < sVar7)) {
          strcpy(__s,zoneid);
          hostname[sVar3 + 2] = '\0';
          sVar7 = sVar3;
        }
        __s[sVar7] = ']';
        CVar6 = CURLUE_OK;
      }
      else {
        CVar6 = CURLUE_BAD_IPV6;
      }
    }
    else if (__s[sVar3] == '%') {
      pcVar8 = __s + sVar3;
      pcVar4 = pcVar8 + 1;
      if ((((pcVar8[1] == '2') && (pcVar8[2] == '5')) && (pcVar8[3] != '\0')) && (pcVar8[3] != ']'))
      {
        pcVar4 = pcVar8 + 3;
      }
      CVar6 = CURLUE_BAD_IPV6;
      for (uVar5 = 0; cVar1 = pcVar4[uVar5], cVar1 != '\0'; uVar5 = uVar5 + 1) {
        if ((cVar1 == ']') || (0xe < uVar5)) {
          if (uVar5 == 0) {
            return CURLUE_BAD_IPV6;
          }
          if (cVar1 != ']') {
            return CURLUE_BAD_IPV6;
          }
          zoneid[uVar5] = '\0';
          pcVar4 = (*Curl_cstrdup)(zoneid);
          u->zoneid = pcVar4;
          if (pcVar4 == (char *)0x0) {
            return CURLUE_OUT_OF_MEMORY;
          }
          pcVar8[0] = ']';
          pcVar8[1] = '\0';
          sVar7 = sVar3;
          goto LAB_0015f25b;
        }
        zoneid[uVar5] = cVar1;
      }
    }
  }
  return CVar6;
}

Assistant:

static CURLUcode ipv6_parse(struct Curl_URL *u, char *hostname,
                            size_t hlen) /* length of hostname */
{
  size_t len;
  DEBUGASSERT(*hostname == '[');
  if(hlen < 4) /* '[::]' is the shortest possible valid string */
    return CURLUE_BAD_IPV6;
  hostname++;
  hlen -= 2;

  /* only valid IPv6 letters are ok */
  len = strspn(hostname, "0123456789abcdefABCDEF:.");

  if(hlen != len) {
    hlen = len;
    if(hostname[len] == '%') {
      /* this could now be '%[zone id]' */
      char zoneid[16];
      int i = 0;
      char *h = &hostname[len + 1];
      /* pass '25' if present and is a URL encoded percent sign */
      if(!strncmp(h, "25", 2) && h[2] && (h[2] != ']'))
        h += 2;
      while(*h && (*h != ']') && (i < 15))
        zoneid[i++] = *h++;
      if(!i || (']' != *h))
        return CURLUE_BAD_IPV6;
      zoneid[i] = 0;
      u->zoneid = strdup(zoneid);
      if(!u->zoneid)
        return CURLUE_OUT_OF_MEMORY;
      hostname[len] = ']'; /* insert end bracket */
      hostname[len + 1] = 0; /* terminate the hostname */
    }
    else
      return CURLUE_BAD_IPV6;
    /* hostname is fine */
  }

  /* Check the IPv6 address. */
  {
    char dest[16]; /* fits a binary IPv6 address */
    char norm[MAX_IPADR_LEN];
    hostname[hlen] = 0; /* end the address there */
    if(1 != Curl_inet_pton(AF_INET6, hostname, dest))
      return CURLUE_BAD_IPV6;

    /* check if it can be done shorter */
    if(Curl_inet_ntop(AF_INET6, dest, norm, sizeof(norm)) &&
       (strlen(norm) < hlen)) {
      strcpy(hostname, norm);
      hlen = strlen(norm);
      hostname[hlen + 1] = 0;
    }
    hostname[hlen] = ']'; /* restore ending bracket */
  }
  return CURLUE_OK;
}